

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::find_function_local_luts
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler,
          bool single_function)

{
  SPIRVariable *this_00;
  bool bVar1;
  uint32_t uVar2;
  Types TVar3;
  pointer ppVar4;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *puVar5;
  size_type sVar6;
  Variant *pVVar7;
  pointer pvVar8;
  size_type sVar9;
  reference pvVar10;
  SPIRBlock *block_00;
  SPIRConstant *pSVar11;
  bool local_131;
  TypedID<(diligent_spirv_cross::Types)0> local_11c;
  int local_118;
  undefined1 local_108 [8];
  StaticExpressionAccessHandler static_expression_handler;
  uint32_t dominator;
  value_type_conflict *block;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3;
  DominatorBuilder builder;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *write_blocks;
  uint32_t local_9c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_98;
  const_iterator itr;
  uint local_88;
  uint32_t static_constant_expression;
  uint32_t uStack_7c;
  bool allow_lut;
  SPIRType *local_78;
  SPIRType *type;
  SPIRVariable *var;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *blocks;
  value_type *accessed_var;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *__range1;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false>
  local_38;
  type local_30;
  CFG *cfg;
  AnalyzeVariableScopeAccessHandler *pAStack_20;
  bool single_function_local;
  AnalyzeVariableScopeAccessHandler *handler_local;
  SPIRFunction *entry_local;
  Compiler *this_local;
  
  cfg._7_1_ = single_function;
  pAStack_20 = handler;
  handler_local = (AnalyzeVariableScopeAccessHandler *)entry;
  entry_local = (SPIRFunction *)this;
  __range1._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(entry->super_IVariant).self);
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
       ::find(&this->function_cfgs,(key_type *)((long)&__range1 + 4));
  ppVar4 = ::std::__detail::
           _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false,_false>
                         *)&local_38);
  local_30 = ::std::
             unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>
             ::operator*(&ppVar4->second);
  puVar5 = &pAStack_20->accessed_variables_to_block;
  __end1 = ::std::
           unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
           ::begin(puVar5);
  accessed_var = (value_type *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::end(puVar5);
  do {
    bVar1 = ::std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                         *)&accessed_var);
    if (!bVar1) {
      return;
    }
    blocks = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)::std::__detail::
                _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                ::operator*(&__end1);
    var = (SPIRVariable *)&((reference)blocks)->second;
    type = (SPIRType *)get<diligent_spirv_cross::SPIRVariable>(this,((reference)blocks)->first);
    local_78 = expression_type(this,*(uint32_t *)&(blocks->_M_h)._M_buckets);
    if (((type->member_types).stack_storage.aligned_char[6] & 1U) == 0) {
      puVar5 = &pAStack_20->complete_write_variables_to_block;
      uStack_7c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      sVar6 = ::std::
              unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::count(puVar5,&stack0xffffffffffffff84);
      local_131 = true;
      if (sVar6 == 0) {
        puVar5 = &pAStack_20->partial_write_variables_to_block;
        static_constant_expression =
             TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        sVar6 = ::std::
                unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                ::count(puVar5,&static_constant_expression);
        local_131 = sVar6 != 0;
      }
      (type->member_types).stack_storage.aligned_char[6] = local_131;
    }
    bVar1 = true;
    if ((type->basetype != Int) && (bVar1 = false, (cfg._7_1_ & 1) != 0)) {
      bVar1 = type->basetype == UShort;
    }
    if (((bVar1) && (((type->member_types).buffer_capacity & 0x100) == 0)) &&
       (bVar1 = VectorView<unsigned_int>::empty(&(local_78->array).super_VectorView<unsigned_int>),
       !bVar1)) {
      local_88 = 0;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize);
      if (uVar2 == 0) {
        puVar5 = &pAStack_20->partial_write_variables_to_block;
        itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
        ._M_cur._4_4_ =
             TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        sVar6 = ::std::
                unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                ::count(puVar5,(key_type *)
                               ((long)&itr.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                                       ._M_cur + 4));
        if (sVar6 == 0) {
          puVar5 = &pAStack_20->complete_write_variables_to_block;
          local_9c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self)
          ;
          local_98._M_cur =
               (__node_type *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::find(puVar5,&local_9c);
          write_blocks = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)::std::
                            end<std::unordered_map<unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>>>>
                                      (&pAStack_20->complete_write_variables_to_block);
          bVar1 = ::std::__detail::operator==
                            (&local_98,
                             (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                              *)&write_blocks);
          if (!bVar1) {
            pvVar8 = ::std::__detail::
                     _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                     ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                                   *)&local_98);
            builder._8_8_ = &pvVar8->second;
            sVar9 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::size((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)builder._8_8_);
            if (sVar9 == 1) {
              DominatorBuilder::DominatorBuilder((DominatorBuilder *)&__range3,local_30);
              this_00 = var;
              __end3 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)var);
              block = (value_type_conflict *)
                      ::std::
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)this_00);
              while (bVar1 = ::std::__detail::operator!=
                                       (&__end3.super__Node_iterator_base<unsigned_int,_false>,
                                        (_Node_iterator_base<unsigned_int,_false> *)&block), bVar1)
              {
                pvVar10 = ::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::
                          operator*(&__end3);
                DominatorBuilder::add_block((DominatorBuilder *)&__range3,*pvVar10);
                ::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++
                          (&__end3);
              }
              static_expression_handler._28_4_ =
                   DominatorBuilder::get_dominator((DominatorBuilder *)&__range3);
              sVar9 = ::std::
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)builder._8_8_,(key_type *)&static_expression_handler.field_0x1c);
              if (sVar9 != 0) {
                uVar2 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(type->super_IVariant).self);
                StaticExpressionAccessHandler::StaticExpressionAccessHandler
                          ((StaticExpressionAccessHandler *)local_108,this,uVar2);
                block_00 = get<diligent_spirv_cross::SPIRBlock>
                                     (this,static_expression_handler._28_4_);
                traverse_all_reachable_opcodes(this,block_00,(OpcodeHandler *)local_108);
                if ((static_expression_handler.variable_id == 1) &&
                   (static_expression_handler.compiler._4_4_ != 0)) {
                  pVVar7 = VectorView<diligent_spirv_cross::Variant>::operator[]
                                     (&(this->ir).ids.
                                       super_VectorView<diligent_spirv_cross::Variant>,
                                      (ulong)static_expression_handler.compiler._4_4_);
                  TVar3 = Variant::get_type(pVVar7);
                  if (TVar3 == TypeConstant) {
                    local_88 = static_expression_handler.compiler._4_4_;
                    local_118 = 0;
                  }
                  else {
                    local_118 = 3;
                  }
                }
                else {
                  local_118 = 3;
                }
                StaticExpressionAccessHandler::~StaticExpressionAccessHandler
                          ((StaticExpressionAccessHandler *)local_108);
                if (local_118 == 0) goto LAB_00db08e5;
              }
            }
          }
        }
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize);
        pVVar7 = VectorView<diligent_spirv_cross::Variant>::operator[]
                           (&(this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>,
                            (ulong)uVar2);
        TVar3 = Variant::get_type(pVVar7);
        if ((TVar3 == TypeConstant) &&
           (local_88 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize),
           ((type->member_types).stack_storage.aligned_char[6] & 1U) == 0)) {
LAB_00db08e5:
          pSVar11 = get<diligent_spirv_cross::SPIRConstant>(this,local_88);
          pSVar11->is_used_as_lut = true;
          TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_11c,local_88);
          *(uint32_t *)((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4) =
               local_11c.id;
          *(undefined1 *)((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 1) = 1;
          *(undefined1 *)((long)&(type->member_types).buffer_capacity + 3) = 1;
        }
      }
    }
    ::std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Compiler::find_function_local_luts(SPIRFunction &entry, const AnalyzeVariableScopeAccessHandler &handler,
                                        bool single_function)
{
	auto &cfg = *function_cfgs.find(entry.self)->second;

	// For each variable which is statically accessed.
	for (auto &accessed_var : handler.accessed_variables_to_block)
	{
		auto &blocks = accessed_var.second;
		auto &var = get<SPIRVariable>(accessed_var.first);
		auto &type = expression_type(accessed_var.first);

		// First check if there are writes to the variable. Later, if there are none, we'll
		// reconsider it as globally accessed LUT.
		if (!var.is_written_to)
		{
			var.is_written_to = handler.complete_write_variables_to_block.count(var.self) != 0 ||
			                    handler.partial_write_variables_to_block.count(var.self) != 0;
		}

		// Only consider function local variables here.
		// If we only have a single function in our CFG, private storage is also fine,
		// since it behaves like a function local variable.
		bool allow_lut = var.storage == StorageClassFunction || (single_function && var.storage == StorageClassPrivate);
		if (!allow_lut)
			continue;

		// We cannot be a phi variable.
		if (var.phi_variable)
			continue;

		// Only consider arrays here.
		if (type.array.empty())
			continue;

		// If the variable has an initializer, make sure it is a constant expression.
		uint32_t static_constant_expression = 0;
		if (var.initializer)
		{
			if (ir.ids[var.initializer].get_type() != TypeConstant)
				continue;
			static_constant_expression = var.initializer;

			// There can be no stores to this variable, we have now proved we have a LUT.
			if (var.is_written_to)
				continue;
		}
		else
		{
			// We can have one, and only one write to the variable, and that write needs to be a constant.

			// No partial writes allowed.
			if (handler.partial_write_variables_to_block.count(var.self) != 0)
				continue;

			auto itr = handler.complete_write_variables_to_block.find(var.self);

			// No writes?
			if (itr == end(handler.complete_write_variables_to_block))
				continue;

			// We write to the variable in more than one block.
			auto &write_blocks = itr->second;
			if (write_blocks.size() != 1)
				continue;

			// The write needs to happen in the dominating block.
			DominatorBuilder builder(cfg);
			for (auto &block : blocks)
				builder.add_block(block);
			uint32_t dominator = builder.get_dominator();

			// The complete write happened in a branch or similar, cannot deduce static expression.
			if (write_blocks.count(dominator) == 0)
				continue;

			// Find the static expression for this variable.
			StaticExpressionAccessHandler static_expression_handler(*this, var.self);
			traverse_all_reachable_opcodes(get<SPIRBlock>(dominator), static_expression_handler);

			// We want one, and exactly one write
			if (static_expression_handler.write_count != 1 || static_expression_handler.static_expression == 0)
				continue;

			// Is it a constant expression?
			if (ir.ids[static_expression_handler.static_expression].get_type() != TypeConstant)
				continue;

			// We found a LUT!
			static_constant_expression = static_expression_handler.static_expression;
		}

		get<SPIRConstant>(static_constant_expression).is_used_as_lut = true;
		var.static_expression = static_constant_expression;
		var.statically_assigned = true;
		var.remapped_variable = true;
	}
}